

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

double __thiscall imrt::ApertureILS::simpleLocalSearch(ApertureILS *this,Plan *P,bool verbose)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  byte in_DL;
  Plan *in_RSI;
  long *in_RDI;
  double dVar3;
  double aux_best;
  double local_best;
  bool improvement;
  double local_20;
  
  bVar1 = true;
  local_20 = Plan::getEvaluation(in_RSI);
  while (bVar1) {
    dVar3 = (double)(**(code **)(*in_RDI + 0x18))((double)(in_DL & 1),in_RDI,in_RSI,1);
    if (dVar3 < local_20) {
      local_20 = dVar3;
    }
    dVar3 = (double)(**(code **)(*in_RDI + 0x20))((double)(in_DL & 1),in_RDI,in_RSI,1);
    bVar1 = dVar3 < local_20;
    if (bVar1) {
      local_20 = dVar3;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Local search finished with: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
  poVar2 = std::operator<<(poVar2," effectively ");
  dVar3 = Plan::getEvaluation(in_RSI);
  this_00 = (void *)std::ostream::operator<<(poVar2,dVar3);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  dVar3 = Plan::getEvaluation(in_RSI);
  return dVar3;
}

Assistant:

double ApertureILS::simpleLocalSearch(Plan& P, bool verbose) {
  bool improvement=true;
  double local_best=P.getEvaluation(), aux_best;
  while (improvement) {
    improvement =false;
    aux_best = iLocalSearch(P, verbose);
    if (aux_best<local_best) {
      local_best=aux_best;
    }
    aux_best = aLocalSearch(P, verbose);
    if (aux_best<local_best) {
      local_best=aux_best;
      improvement=true;
    } 
  }
  cout << "Local search finished with: " << local_best << " effectively "<< P.getEvaluation()<< endl;
  return(P.getEvaluation());
}